

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O3

int evsig_init_(event_base *base)

{
  short *psVar1;
  sigaction **ptr;
  int iVar2;
  
  iVar2 = evutil_make_internal_pipe_((base->sig).ev_signal_pair);
  if (iVar2 != -1) {
    ptr = (base->sig).sh_old;
    if (ptr != (sigaction **)0x0) {
      event_mm_free_(ptr);
    }
    (base->sig).sh_old = (sigaction **)0x0;
    (base->sig).sh_old_max = 0;
    event_assign(&(base->sig).ev_signal,base,(base->sig).ev_signal_pair[0],0x12,evsig_cb,base);
    psVar1 = &(base->sig).ev_signal.ev_evcallback.evcb_flags;
    *(byte *)psVar1 = (byte)*psVar1 | 0x10;
    event_priority_set(&(base->sig).ev_signal,0);
    base->evsigsel = &evsigops;
    return 0;
  }
  event_sock_err(1,-1,"%s: socketpair","evsig_init_");
}

Assistant:

int
evsig_init_(struct event_base *base)
{
	/*
	 * Our signal handler is going to write to one end of the socket
	 * pair to wake up our event loop.  The event loop then scans for
	 * signals that got delivered.
	 */
	if (evutil_make_internal_pipe_(base->sig.ev_signal_pair) == -1) {
#ifdef _WIN32
		/* Make this nonfatal on win32, where sometimes people
		   have localhost firewalled. */
		event_sock_warn(-1, "%s: socketpair", __func__);
#else
		event_sock_err(1, -1, "%s: socketpair", __func__);
#endif
		return -1;
	}

	if (base->sig.sh_old) {
		mm_free(base->sig.sh_old);
	}
	base->sig.sh_old = NULL;
	base->sig.sh_old_max = 0;

	event_assign(&base->sig.ev_signal, base, base->sig.ev_signal_pair[0],
		EV_READ | EV_PERSIST, evsig_cb, base);

	base->sig.ev_signal.ev_flags |= EVLIST_INTERNAL;
	event_priority_set(&base->sig.ev_signal, 0);

	base->evsigsel = &evsigops;

	return 0;
}